

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void raviX_ptrlist_iter_remove(PtrListIterator *self)

{
  undefined2 uVar1;
  PtrList *pPVar2;
  void **__last;
  void **__this;
  PtrListIterator *self_local;
  
  if (-1 < self->__nr) {
    pPVar2 = self->__list;
    uVar1 = *(undefined2 *)self->__list;
    for (__last = self->__list->list_ + self->__nr;
        __last < pPVar2->list_ + (long)(int)(short)(char)uVar1 + -1; __last = __last + 1) {
      *__last = __last[1];
    }
    *__last = (void *)0xf0f0f0f0;
    pPVar2 = self->__list;
    *(ushort *)pPVar2 = *(ushort *)pPVar2 & 0xff00 | (short)(char)*(ushort *)pPVar2 - 1U & 0xff;
    self->__nr = self->__nr + -1;
    return;
  }
  __assert_fail("self->__nr >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x93,"void raviX_ptrlist_iter_remove(PtrListIterator *)");
}

Assistant:

void raviX_ptrlist_iter_remove(PtrListIterator *self)
{
	assert(self->__nr >= 0);
	void **__this = self->__list->list_ + self->__nr;
	void **__last = self->__list->list_ + self->__list->nr_ - 1;
	while (__this < __last) {
		__this[0] = __this[1];
		__this++;
	}
	*__this = (void *)((uintptr_t)0xf0f0f0f0);
	self->__list->nr_--;
	self->__nr--;
}